

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O1

void radio_draw_config(t_radio *x,_glist *glist)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  _glist *p_Var8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint local_154;
  ulong local_148;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  t_atom fontatoms [3];
  char tag [128];
  
  p_Var8 = (x->x_gui).x_glist;
  uVar1 = p_Var8->gl_zoom;
  p_Var8 = glist_getcanvas(p_Var8);
  uVar2 = text_xpix((t_text *)x,glist);
  uVar3 = text_ypix((t_text *)x,glist);
  fontatoms[0].a_type = A_SYMBOL;
  fontatoms[0].a_w.w_symbol = gensym((x->x_gui).x_font);
  fontatoms[1].a_type = A_FLOAT;
  fontatoms[1].a_w._0_4_ = (undefined4)(int)-((x->x_gui).x_fontsize * uVar1);
  fontatoms[2].a_type = A_SYMBOL;
  fontatoms[2].a_w.w_symbol = gensym(sys_fontweight);
  if (x->x_orientation == horizontal) {
    iVar13 = (x->x_gui).x_w;
    iVar11 = 0;
    iVar10 = iVar13;
  }
  else {
    iVar11 = (x->x_gui).x_h;
    iVar13 = iVar11;
    iVar10 = 0;
  }
  if (0 < x->x_number) {
    uVar4 = iVar13 + uVar3;
    iVar15 = iVar13 + 3;
    if (-1 < iVar13) {
      iVar15 = iVar13;
    }
    iVar15 = iVar15 >> 2;
    uVar5 = uVar4 - iVar15;
    uVar6 = iVar15 + uVar3;
    uVar14 = iVar13 + uVar2;
    uVar7 = uVar14 - iVar15;
    uVar16 = iVar15 + uVar2;
    uVar17 = 0;
    local_154 = uVar2;
    uVar12 = uVar3;
    do {
      local_108 = (ulong)uVar5;
      local_110 = (ulong)uVar6;
      local_118 = (ulong)uVar7;
      local_120 = (ulong)uVar16;
      local_148 = (ulong)uVar4;
      uVar9 = (ulong)(uint)(&(x->x_gui).x_fcol)[uVar17 != x->x_on];
      sprintf(tag,"%lxBASE%d",x,(ulong)uVar17);
      pdgui_vmess((char *)0x0,"crs iiii",p_Var8,"coords",tag,(ulong)local_154,(ulong)uVar12,
                  (ulong)uVar14,local_148);
      pdgui_vmess((char *)0x0,"crs ri rk",p_Var8,"itemconfigure",tag,"-width",(ulong)uVar1,"-fill",
                  (ulong)(uint)(x->x_gui).x_bcol);
      sprintf(tag,"%lxBUT%d",x,(ulong)uVar17);
      pdgui_vmess((char *)0x0,"crs iiii",p_Var8,"coords",tag,local_120,local_110,local_118,local_108
                 );
      pdgui_vmess((char *)0x0,"crs rk rk",p_Var8,"itemconfigure",tag,"-fill",uVar9,"-outline",uVar9)
      ;
      local_154 = local_154 + iVar10;
      uVar14 = uVar14 + iVar10;
      uVar16 = uVar16 + iVar10;
      uVar7 = uVar7 + iVar10;
      uVar12 = uVar12 + iVar11;
      uVar4 = uVar4 + iVar11;
      uVar6 = uVar6 + iVar11;
      uVar5 = uVar5 + iVar11;
      x->x_drawn = x->x_on;
      uVar17 = uVar17 + 1;
    } while ((int)uVar17 < x->x_number);
  }
  sprintf(tag,"%lxLABEL",x);
  pdgui_vmess((char *)0x0,"crs ii",p_Var8,"coords",tag,(ulong)((x->x_gui).x_ldx * uVar1 + uVar2),
              (ulong)(uVar1 * (x->x_gui).x_ldy + uVar3));
  pdgui_vmess((char *)0x0,"crs rA rk",p_Var8,"itemconfigure",tag,"-font",3,fontatoms,"-fill",
              (ulong)(uint)(x->x_gui).x_lcol);
  iemgui_dolabel(x,&x->x_gui,(x->x_gui).x_lab,1);
  return;
}

Assistant:

static void radio_draw_config(t_radio* x, t_glist* glist)
{
    int i;
    const int zoom = IEMGUI_ZOOM(x);
    t_iemgui *iemgui = &x->x_gui;
    t_canvas *canvas = glist_getcanvas(glist);
    int iow = IOWIDTH * zoom, ioh = IEM_GUI_IOHEIGHT * zoom;
    int xx11b = text_xpix(&x->x_gui.x_obj, glist);
    int yy11b = text_ypix(&x->x_gui.x_obj, glist);
    int d, dx = 0, dy = 0, d4;

    int xx11=xx11b, xx12=0, xx21=0, xx22=0;
    int yy11=yy11b, yy12=0, yy21=0, yy22=0;

    char tag[128];
    t_atom fontatoms[3];
    SETSYMBOL(fontatoms+0, gensym(iemgui->x_font));
    SETFLOAT (fontatoms+1, -iemgui->x_fontsize*zoom);
    SETSYMBOL(fontatoms+2, gensym(sys_fontweight));

    if(x->x_orientation == horizontal)
    {
        d = dx = x->x_gui.x_w;
    } else {
        d = dy = x->x_gui.x_h;
    }
    d4 = d / 4;
    xx12 = xx11 + d;
    xx21 = xx11 + d4;
    xx22 = xx12 - d4;
    yy12 = yy11 + d;
    yy21 = yy11 + d4;
    yy22 = yy12 - d4;

    for(i = 0; i < x->x_number; i++)
    {
        int col = (x->x_on == i) ? x->x_gui.x_fcol : x->x_gui.x_bcol;
        sprintf(tag, "%lxBASE%d", x, i);
        pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
            xx11, yy11, xx12, yy12);
        pdgui_vmess(0, "crs ri rk", canvas, "itemconfigure", tag,
            "-width", zoom, "-fill", x->x_gui.x_bcol);

        sprintf(tag, "%lxBUT%d", x, i);
        pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
            xx21, yy21, xx22, yy22);
        pdgui_vmess(0, "crs rk rk", canvas, "itemconfigure", tag,
            "-fill", col, "-outline", col);
        xx11 += dx; xx12 += dx; xx21 += dx; xx22 += dx;
        yy11 += dy; yy12 += dy; yy21 += dy; yy22 += dy;

        x->x_drawn = x->x_on;
    }

    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crs ii", canvas, "coords", tag,
        xx11b + x->x_gui.x_ldx * zoom, yy11b + x->x_gui.x_ldy * zoom);
    pdgui_vmess(0, "crs rA rk", canvas, "itemconfigure", tag,
        "-font", 3, fontatoms,
        "-fill", x->x_gui.x_lcol);
    iemgui_dolabel(x, &x->x_gui, x->x_gui.x_lab, 1);
}